

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O0

void __thiscall
Script_IsPushOnly_false_Test::~Script_IsPushOnly_false_Test(Script_IsPushOnly_false_Test *this)

{
  Script_IsPushOnly_false_Test *this_local;
  
  ~Script_IsPushOnly_false_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Script, IsPushOnly_false) {
  ScriptBuilder builder;
  builder.AppendData(5);
  builder.AppendData(2);
  builder.AppendOperator(ScriptOperator::OP_ADD);
  builder.AppendData(7);
  builder.AppendOperator(ScriptOperator::OP_EQUALVERIFY);
  Script script = builder.Build();
  EXPECT_EQ(script.IsPushOnly(), false);
}